

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priority_list.cpp
# Opt level: O0

Am_Object __thiscall
Am_Priority_List::Get
          (Am_Priority_List *this,float *main_priority,int *second_priority,int *third_priority)

{
  undefined4 *in_R8;
  int *third_priority_local;
  int *second_priority_local;
  float *main_priority_local;
  Am_Priority_List *this_local;
  
  if (*(long *)(main_priority + 2) != 0) {
    *second_priority = *(int *)(*(long *)(main_priority + 2) + 8);
    *third_priority = *(int *)(*(long *)(main_priority + 2) + 0xc);
    *in_R8 = *(undefined4 *)(*(long *)(main_priority + 2) + 0x10);
    Am_Object::Am_Object((Am_Object *)this,*(Am_Object **)(main_priority + 2));
    return (Am_Object)(Am_Object_Data *)this;
  }
  Am_Error("Call to Get on priority list but no current item");
}

Assistant:

Am_Object
Am_Priority_List::Get(float &main_priority, int &second_priority,
                      int &third_priority)
{
  if (current) {
    main_priority = current->main_priority;
    second_priority = current->second_priority;
    third_priority = current->third_priority;
    return current->obj;
  } else {
    Am_Error("Call to Get on priority list but no current item");
    return nullptr;
  }
}